

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightedSnapshot.cc
# Opt level: O3

void __thiscall cppmetrics::WeightedSnapshot::~WeightedSnapshot(WeightedSnapshot *this)

{
  pointer pEVar1;
  
  (this->super_Snapshot)._vptr_Snapshot = (_func_int **)&PTR__WeightedSnapshot_00120c60;
  pEVar1 = (this->m_elements).
           super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1,(long)(this->m_elements).
                                 super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar1);
    return;
  }
  return;
}

Assistant:

double WeightedSnapshot::get_value(double quantile) const
{
  if (quantile < 0 || quantile > 1.0 || std::isnan(quantile))
  {
    throw std::domain_error{"Quantile must be between 0.0 and 1.0"};
  }

  if (size() == 0)
  {
    return 0.0;
  }

  auto lb = std::lower_bound(
    std::begin(m_elements), std::end(m_elements), quantile,
    [](const Element& element, const double& q) { return element.quantile < q; }
  );

  if (lb == std::begin(m_elements))
  {
    // All values are of a greater quantile than requested; just return
    // the least.
    return get_min();
  }

  if (lb == std::end(m_elements))
  {
    // All values have a smaller quantile than requested; return the max.
    return get_max();
  }

  // At this point lb is pointed to the first element *not less than* the request
  // quantile.  Back up one and return its value.
  if (!HasEquivalentOrder(quantile, lb->quantile))
  {
    --lb;
  }

  return lb->value;
}